

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void SetupPlayerClasses(void)

{
  bool bVar1;
  PClassPlayerPawn *ti;
  uint i;
  ulong uVar2;
  FPlayerClass newclass;
  FName local_54;
  FPlayerClass local_50;
  
  local_50.Skins.Array = (int *)0x0;
  local_50.Skins.Most = 0;
  local_50.Skins.Count = 0;
  local_50.Type = (PClassPlayerPawn *)0x0;
  local_50.Flags = 0;
  TArray<FPlayerClass,_FPlayerClass>::Clear(&PlayerClasses);
  for (uVar2 = 0; uVar2 < gameinfo.PlayerClasses.Count; uVar2 = uVar2 + 1) {
    local_54.Index = gameinfo.PlayerClasses.Array[uVar2].Index;
    ti = (PClassPlayerPawn *)PClass::FindActor(&local_54);
    bVar1 = ValidatePlayerClass((PClassActor *)ti,
                                FName::NameData.NameArray[gameinfo.PlayerClasses.Array[uVar2].Index]
                                .Text);
    if (bVar1) {
      local_50.Flags = (DWORD)(((ti->super_PClassActor).super_PClass.Defaults[0x1d2] & 0x40) != 0);
      local_50.Type = ti;
      TArray<FPlayerClass,_FPlayerClass>::Push(&PlayerClasses,&local_50);
    }
  }
  TArray<int,_int>::~TArray(&local_50.Skins);
  return;
}

Assistant:

FPlayerClass::FPlayerClass ()
{
	Type = NULL;
	Flags = 0;
}